

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cc
# Opt level: O1

Status __thiscall
leveldb::DoWriteStringToFile(leveldb *this,Env *env,Slice *data,string *fname,bool should_sync)

{
  void *pvVar1;
  long in_FS_OFFSET;
  WritableFile *file;
  void *local_48;
  void *local_40;
  long *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (*env->_vptr_Env[4])(this,env,fname,&local_38);
  if (*(long *)this == 0) {
    (**(code **)(*local_38 + 0x10))(&local_40,local_38,data);
    pvVar1 = *(void **)this;
    *(void **)this = local_40;
    local_40 = pvVar1;
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    if (should_sync && *(long *)this == 0) {
      (**(code **)(*local_38 + 0x28))(&local_40);
      pvVar1 = *(void **)this;
      *(void **)this = local_40;
      local_40 = pvVar1;
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    if (*(long *)this == 0) {
      (**(code **)(*local_38 + 0x18))(&local_40);
      pvVar1 = *(void **)this;
      *(void **)this = local_40;
      local_40 = pvVar1;
      if (pvVar1 != (void *)0x0) {
        operator_delete__(pvVar1);
      }
    }
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    if (*(long *)this != 0) {
      (*env->_vptr_Env[8])(&local_48,env,fname);
      if (local_48 != (void *)0x0) {
        operator_delete__(local_48);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

static Status DoWriteStringToFile(Env* env, const Slice& data,
                                  const std::string& fname, bool should_sync) {
  WritableFile* file;
  Status s = env->NewWritableFile(fname, &file);
  if (!s.ok()) {
    return s;
  }
  s = file->Append(data);
  if (s.ok() && should_sync) {
    s = file->Sync();
  }
  if (s.ok()) {
    s = file->Close();
  }
  delete file;  // Will auto-close if we did not close above
  if (!s.ok()) {
    env->DeleteFile(fname);
  }
  return s;
}